

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d.c
# Opt level: O1

void av1_get_inv_txfm_cfg(TX_TYPE tx_type,TX_SIZE tx_size,TXFM_2D_FLIP_CFG *cfg)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  
  cfg->tx_size = tx_size;
  cfg->stage_range_col[0] = '\0';
  cfg->stage_range_col[1] = '\0';
  cfg->stage_range_col[2] = '\0';
  cfg->stage_range_col[3] = '\0';
  cfg->stage_range_col[4] = '\0';
  cfg->stage_range_col[5] = '\0';
  cfg->stage_range_col[6] = '\0';
  cfg->stage_range_col[7] = '\0';
  *(undefined8 *)(cfg->stage_range_col + 8) = 0;
  cfg->stage_range_row[4] = '\0';
  cfg->stage_range_row[5] = '\0';
  cfg->stage_range_row[6] = '\0';
  cfg->stage_range_row[7] = '\0';
  cfg->stage_range_row[8] = '\0';
  cfg->stage_range_row[9] = '\0';
  cfg->stage_range_row[10] = '\0';
  cfg->stage_range_row[0xb] = '\0';
  iVar3 = 0;
  iVar4 = 0;
  if (tx_type < 0x10) {
    iVar3 = *(int *)(&DAT_004e167c + (uint)tx_type * 4);
    iVar4 = *(int *)(&DAT_004e16bc + (uint)tx_type * 4);
  }
  cfg->ud_flip = iVar3;
  cfg->lr_flip = iVar4;
  bVar1 = ""[tx_type];
  bVar2 = ""[tx_type];
  cfg->shift = av1_inv_txfm_shift_ls[tx_size];
  iVar3 = tx_size_wide_log2[tx_size];
  iVar4 = tx_size_high_log2[tx_size];
  cfg->cos_bit_col = '\f';
  cfg->cos_bit_row = '\f';
  bVar1 = *(byte *)((ulong)bVar1 + (long)iVar4 * 4 + 0x4e1b68);
  cfg->txfm_type_col = bVar1;
  if ((ulong)bVar1 == 5) {
    cfg->stage_range_col[3] = '\0';
    cfg->stage_range_col[4] = '\0';
    cfg->stage_range_col[5] = '\0';
    cfg->stage_range_col[6] = '\0';
    cfg->stage_range_col[0] = '\0';
    cfg->stage_range_col[1] = '\x01';
    cfg->stage_range_col[2] = '\0';
    cfg->stage_range_col[3] = '\0';
  }
  bVar2 = av1_txfm_type_ls[(long)iVar3 + -2][bVar2];
  cfg->txfm_type_row = bVar2;
  if ((ulong)bVar2 == 5) {
    cfg->stage_range_row[3] = '\0';
    cfg->stage_range_row[4] = '\0';
    cfg->stage_range_row[5] = '\0';
    cfg->stage_range_row[6] = '\0';
    cfg->stage_range_row[0] = '\0';
    cfg->stage_range_row[1] = '\x01';
    cfg->stage_range_row[2] = '\0';
    cfg->stage_range_row[3] = '\0';
  }
  cfg->stage_num_col = (int)"\x04\x06\b\n\f\a\b\n\x01\x01\x01\x01"[bVar1];
  cfg->stage_num_row = (int)"\x04\x06\b\n\f\a\b\n\x01\x01\x01\x01"[bVar2];
  return;
}

Assistant:

void av1_get_inv_txfm_cfg(TX_TYPE tx_type, TX_SIZE tx_size,
                          TXFM_2D_FLIP_CFG *cfg) {
  assert(cfg != NULL);
  cfg->tx_size = tx_size;
  av1_zero(cfg->stage_range_col);
  av1_zero(cfg->stage_range_row);
  set_flip_cfg(tx_type, cfg);
  const TX_TYPE_1D tx_type_1d_col = vtx_tab[tx_type];
  const TX_TYPE_1D tx_type_1d_row = htx_tab[tx_type];
  cfg->shift = av1_inv_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  cfg->cos_bit_col = INV_COS_BIT;
  cfg->cos_bit_row = INV_COS_BIT;
  cfg->txfm_type_col = av1_txfm_type_ls[txh_idx][tx_type_1d_col];
  if (cfg->txfm_type_col == TXFM_TYPE_ADST4) {
    memcpy(cfg->stage_range_col, iadst4_range, sizeof(iadst4_range));
  }
  cfg->txfm_type_row = av1_txfm_type_ls[txw_idx][tx_type_1d_row];
  if (cfg->txfm_type_row == TXFM_TYPE_ADST4) {
    memcpy(cfg->stage_range_row, iadst4_range, sizeof(iadst4_range));
  }
  cfg->stage_num_col = av1_txfm_stage_num_list[cfg->txfm_type_col];
  cfg->stage_num_row = av1_txfm_stage_num_list[cfg->txfm_type_row];
}